

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

BSDFSample * __thiscall
pbrt::NormalizedFresnelBxDF::Sample_f
          (NormalizedFresnelBxDF *this,Vector3f wo,Float uc,Point2f u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Point2f u_00;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wo_00;
  Vector3f wo_01;
  int iVar3;
  BxDFReflTransFlags in_ECX;
  BSDFSample *in_RDI;
  Float pdf;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  float in_XMM1_Da;
  undefined1 auVar8 [56];
  undefined1 in_ZMM3 [64];
  Vector3f VVar9;
  SampledSpectrum SVar10;
  Vector3f wi;
  BSDFSample *this_00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  TransportMode in_stack_ffffffffffffff3c;
  NormalizedFresnelBxDF *in_stack_ffffffffffffff40;
  NormalizedFresnelBxDF *this_01;
  undefined4 in_stack_ffffffffffffff5c;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar14;
  undefined4 local_40;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  vmovlpd_avx(in_ZMM3._0_16_);
  this_00 = in_RDI;
  iVar3 = operator&(in_ECX,Reflection);
  if (iVar3 == 0) {
    memset(in_RDI,0,0x2c);
    BSDFSample::BSDFSample(this_00);
  }
  else {
    auVar6 = ZEXT856(0);
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffff08;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffff04;
    VVar9 = SampleCosineHemisphere(u_00);
    local_40 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    this_01 = (NormalizedFresnelBxDF *)vmovlpd_avx(auVar4._0_16_);
    if (in_XMM1_Da < 0.0) {
      local_40 = local_40 * -1.0;
    }
    fVar11 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    auVar6 = ZEXT856(0);
    auVar8 = (undefined1  [56])0x0;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffff7c;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_40;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffff5c;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_40;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
    fVar13 = local_40;
    fVar14 = fVar11;
    SVar10 = f(in_stack_ffffffffffffff40,wo_00,wi_00,in_stack_ffffffffffffff3c);
    auVar7._0_8_ = SVar10.values.values._8_8_;
    auVar7._8_56_ = auVar8;
    auVar5._0_8_ = SVar10.values.values._0_8_;
    auVar5._8_56_ = auVar6;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    uVar2 = vmovlpd_avx(auVar7._0_16_);
    wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffff7c;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.x = fVar13;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar14;
    wi_01.super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
    wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffff5c;
    wi_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
    pdf = PDF(this_01,wo_01,wi_01,in_stack_ffffffffffffff3c,(BxDFReflTransFlags)in_XMM1_Da);
    SVar10.values.values[2] = (float)(int)uVar2;
    SVar10.values.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
    SVar10.values.values[0] = (float)(int)uVar1;
    SVar10.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
    VVar9.super_Tuple3<pbrt::Vector3,_float>.z = local_40;
    VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = this_01;
    BSDFSample::BSDFSample(in_RDI,SVar10,VVar9,pdf,DiffuseReflection,1.0,false);
  }
  return this_00;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, Point2f u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return {};

        // Cosine-sample the hemisphere, flipping the direction if necessary
        Vector3f wi = SampleCosineHemisphere(u);
        if (wo.z < 0)
            wi.z *= -1;
        return BSDFSample(f(wo, wi, mode), wi, PDF(wo, wi, mode, sampleFlags),
                          BxDFFlags::DiffuseReflection);
    }